

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::fboc::details::RenderableParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,RenderableParams *this,RenderableParams *params)

{
  ImageFormat IVar1;
  long lVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fmtStr;
  string typeStr;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  long *local_30 [2];
  long local_20 [2];
  
  IVar1 = this->format;
  pcVar3 = glu::getTextureFormatName(IVar1.format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,pcVar3,(allocator<char> *)local_30);
  if ((ulong)IVar1 >> 0x20 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_50,local_48 + (long)local_50);
  }
  else {
    pcVar3 = glu::getTypeName(IVar1.unsizedType);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_30,pcVar3,(allocator<char> *)local_70);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_48 + (long)local_50)
    ;
    std::__cxx11::string::append((char *)local_70);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_30[0]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string		getDescription		(const RenderableParams& params)
	{
		return formatDesc(params.format);
	}